

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O1

void __thiscall ContainerToReaderWrapper::deleteReader(ContainerToReaderWrapper *this,int readerID)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long *plVar3;
  _Base_ptr p_Var4;
  iterator __position;
  bool bVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_DemuxerReadPolicy>_>,_std::_Rb_tree_iterator<std::pair<const_int,_DemuxerReadPolicy>_>_>
  pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
  pVar7;
  
  p_Var1 = &(this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5]) {
    bVar5 = p_Var2[1]._M_color < (uint)readerID;
    if (!bVar5) {
      p_Var4 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, (uint)readerID < p_Var4[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    p_Var2 = __position._M_node[1]._M_parent;
    pVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_DemuxerReadPolicy>,_std::_Select1st<std::pair<const_int,_DemuxerReadPolicy>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
            ::equal_range((_Rb_tree<int,_std::pair<const_int,_DemuxerReadPolicy>,_std::_Select1st<std::pair<const_int,_DemuxerReadPolicy>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
                           *)p_Var2,(key_type_conflict *)&__position._M_node[1]._M_left);
    std::
    _Rb_tree<int,_std::pair<const_int,_DemuxerReadPolicy>,_std::_Select1st<std::pair<const_int,_DemuxerReadPolicy>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
    ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_DemuxerReadPolicy>,_std::_Select1st<std::pair<const_int,_DemuxerReadPolicy>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
                    *)p_Var2,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
    if (__position._M_node[1]._M_parent[1]._M_parent == (_Base_ptr)0x0) {
      plVar3 = *(long **)(__position._M_node[1]._M_parent + 3);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
      pVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
              ::equal_range(&(this->m_demuxers)._M_t,
                            (key_type *)&__position._M_node[1]._M_parent[3]._M_parent);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
      ::_M_erase_aux(&(this->m_demuxers)._M_t,(_Base_ptr)pVar7.first._M_node,
                     (_Base_ptr)pVar7.second._M_node);
    }
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>,std::_Select1st<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>,std::_Select1st<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>>
                        *)&this->m_readerInfo,__position);
    return;
  }
  return;
}

Assistant:

void ContainerToReaderWrapper::deleteReader(const int readerID)
{
    const auto itr = m_readerInfo.find(readerID);
    if (itr == m_readerInfo.end())
        return;
    const ReaderInfo& ri = itr->second;
    ri.m_demuxerData.m_pids.erase(ri.m_pid);
    if (ri.m_demuxerData.m_pids.empty())
    {
        delete ri.m_demuxerData.m_demuxer;
        m_demuxers.erase(ri.m_demuxerData.m_streamName);
    }
    m_readerInfo.erase(itr);
}